

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void * __thiscall asmjit::Zone::_alloc(Zone *this,size_t size)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong in_RSI;
  long *in_RDI;
  bool bVar5;
  Block *newBlock;
  Block *next;
  size_t blockAlignment;
  size_t blockSize;
  uint8_t *p;
  Block *curBlock;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  ulong local_70;
  ulong local_68;
  undefined1 *local_58;
  ulong local_50 [2];
  void *local_40;
  size_t local_8;
  
  local_58 = (undefined1 *)in_RDI[2];
  local_70 = (ulong)*(uint *)(in_RDI + 3);
  local_50[0] = in_RSI;
  puVar2 = std::max<unsigned_long>(&local_70,local_50);
  local_68 = *puVar2;
  uVar3 = (ulong)(uint)(1 << ((byte)*(undefined4 *)((long)in_RDI + 0x1c) & 0x1f));
  bVar5 = true;
  if (local_58 != Zone_zeroBlock) {
    bVar5 = (ulong)(in_RDI[1] - *in_RDI) < local_50[0];
  }
  if (bVar5) {
    puVar1 = *(undefined8 **)(local_58 + 8);
    if ((puVar1 == (undefined8 *)0x0) || ((ulong)puVar1[2] < local_50[0])) {
      if (-uVar3 - 0x21 < local_68) {
        local_40 = (void *)0x0;
      }
      else {
        local_68 = uVar3 + local_68;
        local_8 = local_68 + 0x20;
        puVar4 = (undefined8 *)malloc(local_8);
        if (puVar4 == (undefined8 *)0x0) {
          local_40 = (void *)0x0;
        }
        else {
          local_40 = (void *)((long)puVar4 + uVar3 + 0x17 & (uVar3 - 1 ^ 0xffffffffffffffff));
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4[2] = local_68;
          if (local_58 != Zone_zeroBlock) {
            *puVar4 = local_58;
            *(undefined8 **)(local_58 + 8) = puVar4;
            if (puVar1 != (undefined8 *)0x0) {
              puVar4[1] = puVar1;
              *puVar1 = puVar4;
            }
          }
          in_RDI[2] = (long)puVar4;
          *in_RDI = (long)local_40 + local_50[0];
          in_RDI[1] = (long)puVar4 + local_68 + 0x18;
        }
      }
    }
    else {
      local_40 = (void *)((long)puVar1 + uVar3 + 0x17 & (uVar3 - 1 ^ 0xffffffffffffffff));
      in_RDI[2] = (long)puVar1;
      *in_RDI = (long)local_40 + local_50[0];
      in_RDI[1] = (long)puVar1 + puVar1[2] + 0x18;
    }
    return local_40;
  }
  DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
}

Assistant:

void* Zone::_alloc(size_t size) noexcept {
  Block* curBlock = _block;
  uint8_t* p;

  size_t blockSize = std::max<size_t>(_blockSize, size);
  size_t blockAlignment = getBlockAlignment();

  // The `_alloc()` method can only be called if there is not enough space
  // in the current block, see `alloc()` implementation for more details.
  ASMJIT_ASSERT(curBlock == &Zone_zeroBlock || getRemainingSize() < size);

  // If the `Zone` has been cleared the current block doesn't have to be the
  // last one. Check if there is a block that can be used instead of allocating
  // a new one. If there is a `next` block it's completely unused, we don't have
  // to check for remaining bytes.
  Block* next = curBlock->next;
  if (next && next->size >= size) {
    p = Utils::alignTo(next->data, blockAlignment);

    _block = next;
    _ptr = p + size;
    _end = next->data + next->size;

    return static_cast<void*>(p);
  }

  // Prevent arithmetic overflow.
  if (ASMJIT_UNLIKELY(blockSize > (~static_cast<size_t>(0) - sizeof(Block) - blockAlignment)))
    return nullptr;

  blockSize += blockAlignment;
  Block* newBlock = static_cast<Block*>(Internal::allocMemory(sizeof(Block) + blockSize));

  if (ASMJIT_UNLIKELY(!newBlock))
    return nullptr;

  // Align the pointer to `blockAlignment` and adjust the size of this block
  // accordingly. It's the same as using `blockAlignment - Utils::alignDiff()`,
  // just written differently.
  p = Utils::alignTo(newBlock->data, blockAlignment);
  newBlock->prev = nullptr;
  newBlock->next = nullptr;
  newBlock->size = blockSize;

  if (curBlock != &Zone_zeroBlock) {
    newBlock->prev = curBlock;
    curBlock->next = newBlock;

    // Does only happen if there is a next block, but the requested memory
    // can't fit into it. In this case a new buffer is allocated and inserted
    // between the current block and the next one.
    if (next) {
      newBlock->next = next;
      next->prev = newBlock;
    }
  }

  _block = newBlock;
  _ptr = p + size;
  _end = newBlock->data + blockSize;

  return static_cast<void*>(p);
}